

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int gen_publickey_from_sk_ecdsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,uint8_t *flags,char **application,
              uchar **key_handle,size_t *handle_len,EVP_PKEY **ec_ctx)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  char *pcVar5;
  size_t sVar6;
  uchar *p;
  uchar *point_buf;
  size_t pointlen;
  size_t curvelen;
  uchar *curve;
  size_t local_78;
  EVP_PKEY *local_70;
  size_t *local_68;
  uchar *local_60;
  uchar *local_58;
  uchar *local_50;
  size_t local_48;
  size_t local_40;
  uchar *local_38;
  
  local_70 = (EVP_PKEY *)0x0;
  iVar2 = _libssh2_get_string(decrypted,&local_38,&local_40);
  if ((iVar2 != 0) || (local_40 == 0)) {
    pcVar5 = "ECDSA no curve";
LAB_00119c45:
    _libssh2_error(session,-0xe,pcVar5);
    return -1;
  }
  iVar2 = _libssh2_get_string(decrypted,&local_50,&local_48);
  if (iVar2 != 0) {
    pcVar5 = "ECDSA no point";
    goto LAB_00119c45;
  }
  iVar2 = _libssh2_ecdsa_curve_name_with_octal_new
                    ((EVP_PKEY **)&local_70,local_50,local_48,LIBSSH2_EC_CURVE_NISTP256);
  if (iVar2 == 0) {
    local_68 = pubkeydata_len;
    iVar3 = _libssh2_get_string(decrypted,&local_60,&local_78);
    iVar2 = 0;
    if (iVar3 == 0) {
      if ((flags == (uint8_t *)0x0) || (iVar3 = _libssh2_get_byte(decrypted,flags), iVar3 == 0)) {
        if (handle_len != (size_t *)0x0 && key_handle != (uchar **)0x0) {
          local_58 = (uchar *)0x0;
          iVar3 = _libssh2_get_string(decrypted,&local_58,handle_len);
          if (iVar3 == 0) {
            if (*handle_len != 0) {
              puVar4 = (uchar *)(*session->alloc)(*handle_len,&session->abstract);
              *key_handle = puVar4;
              if (puVar4 != (uchar *)0x0) {
                memcpy(puVar4,local_58,*handle_len);
              }
            }
          }
          else {
            _libssh2_error(session,-0xe,"No SK key_handle.");
          }
          iVar2 = 0;
          if (iVar3 != 0) goto LAB_00119cc4;
        }
        iVar2 = 0;
        if (((pubkeydata != (uchar **)0x0) && (iVar2 = 0, method != (uchar **)0x0)) &&
           (local_70 != (EVP_PKEY *)0x0)) {
          iVar2 = gen_publickey_from_ec_evp
                            (session,method,method_len,pubkeydata,local_68,1,(EVP_PKEY *)local_70);
        }
        psVar1 = local_68;
        if (iVar2 != 0 || pubkeydata == (uchar **)0x0) {
LAB_00119eb1:
          if (ec_ctx != (EVP_PKEY **)0x0) {
            *ec_ctx = (EVP_PKEY *)local_70;
            return iVar2;
          }
          EVP_PKEY_free(local_70);
          return iVar2;
        }
        sVar6 = *local_68 + local_78 + 4;
        puVar4 = (uchar *)(*session->alloc)(sVar6,&session->abstract);
        if (puVar4 != (uchar *)0x0) {
          local_58 = puVar4 + *psVar1;
          memcpy(puVar4,*pubkeydata,*psVar1);
          _libssh2_store_str(&local_58,(char *)local_60,local_78);
          if (local_78 != 0 && application != (char **)0x0) {
            pcVar5 = (char *)(*session->alloc)(local_78 + 1,&session->abstract);
            *application = pcVar5;
            explicit_bzero(pcVar5,local_78 + 1);
            memcpy(*application,local_60,local_78);
          }
          (*session->free)(*pubkeydata,&session->abstract);
          *local_68 = sVar6;
          *pubkeydata = puVar4;
          goto LAB_00119eb1;
        }
        iVar2 = -1;
        goto LAB_00119cc4;
      }
      pcVar5 = "No SK flags.";
    }
    else {
      pcVar5 = "No SK application.";
      iVar2 = 0;
    }
  }
  else {
    pcVar5 = "ECDSA could not create key";
    iVar2 = -1;
  }
  _libssh2_error(session,-0xe,pcVar5);
LAB_00119cc4:
  if (local_70 != (EVP_PKEY *)0x0) {
    EVP_PKEY_free(local_70);
  }
  if ((application != (char **)0x0) && (*application != (char *)0x0)) {
    (*session->free)(application,&session->abstract);
    *application = (char *)0x0;
  }
  if (key_handle == (uchar **)0x0) {
    return iVar2;
  }
  if (*key_handle == (uchar *)0x0) {
    return iVar2;
  }
  (*session->free)(key_handle,&session->abstract);
  *key_handle = (uchar *)0x0;
  return iVar2;
}

Assistant:

static int
gen_publickey_from_sk_ecdsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                              struct string_buf *decrypted,
                                              unsigned char **method,
                                              size_t *method_len,
                                              unsigned char **pubkeydata,
                                              size_t *pubkeydata_len,
                                              uint8_t *flags,
                                              const char **application,
                                              const unsigned char **key_handle,
                                              size_t *handle_len,
                                              libssh2_ecdsa_ctx **ec_ctx)
{
    int rc = 0;
    size_t curvelen, pointlen, key_len, app_len;
    unsigned char *curve, *point_buf, *p, *key, *app;
    libssh2_ecdsa_ctx *ec_key = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Extracting ECDSA-SK public key"));

    if(_libssh2_get_string(decrypted, &curve, &curvelen) ||
        curvelen == 0) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no curve");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &point_buf, &pointlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no point");
        return -1;
    }

    rc = _libssh2_ecdsa_curve_name_with_octal_new(&ec_key,
                                                  point_buf, pointlen,
                                                  LIBSSH2_EC_CURVE_NISTP256);
    if(rc) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA could not create key");
        goto fail;
    }

    if(_libssh2_get_string(decrypted, &app, &app_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK application.");
        goto fail;
    }

    if(flags && _libssh2_get_byte(decrypted, flags)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK flags.");
        goto fail;
    }

    if(key_handle && handle_len) {
        unsigned char *handle = NULL;
        if(_libssh2_get_string(decrypted, &handle, handle_len)) {
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "No SK key_handle.");
            goto fail;
        }

        if(*handle_len > 0) {
            *key_handle = LIBSSH2_ALLOC(session, *handle_len);

            if(*key_handle) {
                memcpy((void *)LIBSSH2_UNCONST(*key_handle),
                       handle, *handle_len);
            }
        }
    }

    if(rc == 0 && ec_key && pubkeydata && method) {
#ifdef USE_OPENSSL_3
        EVP_PKEY *pk = ec_key;
#else
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pk, ec_key);
#endif

        rc = gen_publickey_from_ec_evp(session, method, method_len,
                                       pubkeydata, pubkeydata_len,
                                       1, pk);

#ifndef USE_OPENSSL_3
        if(pk)
            EVP_PKEY_free(pk);
#endif
    }

    if(rc == 0 && pubkeydata) {
        key_len = *pubkeydata_len + app_len + 4;
        key = LIBSSH2_ALLOC(session, key_len);

        if(!key) {
            rc = -1;
            goto fail;
        }

        p = key + *pubkeydata_len;

        memcpy(key, *pubkeydata, *pubkeydata_len);
        _libssh2_store_str(&p, (const char *)app, app_len);

        if(application && app_len > 0) {
            *application = LIBSSH2_ALLOC(session, app_len + 1);
            _libssh2_explicit_zero((void *)LIBSSH2_UNCONST(*application),
                                   app_len + 1);
            memcpy((void *)LIBSSH2_UNCONST(*application), app, app_len);
        }

        LIBSSH2_FREE(session, *pubkeydata);
        *pubkeydata_len = key_len;

        if(pubkeydata)
            *pubkeydata = key;
        else if(key)
            LIBSSH2_FREE(session, key);
    }

    if(ec_ctx)
        *ec_ctx = ec_key;
    else
        _libssh2_ecdsa_free(ec_key);

    return rc;

fail:
    if(ec_key)
        _libssh2_ecdsa_free(ec_key);

    if(application && *application) {
        LIBSSH2_FREE(session, (void *)application);
        *application = NULL;
    }

    if(key_handle && *key_handle) {
        LIBSSH2_FREE(session, (void *)key_handle);
        *key_handle = NULL;
    }

    return rc;
}